

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O2

partSizeData *
initAndReadDeepScanLine
          (partSizeData *__return_storage_ptr__,vector<int,_std::allocator<int>_> *sampleCount,
          vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          *sampleData,
          vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
          *pixelPtrs,DeepFrameBuffer *buf,DeepScanLineInputPart *in,
          vector<int,_std::allocator<int>_> *inputSampleCount,Header *outHeader,
          vector<double,_std::allocator<double>_> *countPerf,
          vector<double,_std::allocator<double>_> *samplePerf)

{
  int iVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  int iVar3;
  int iVar4;
  uint64_t p;
  int *piVar5;
  Header *h;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  long lVar8;
  Compression *pCVar9;
  long lVar10;
  size_type __new_size;
  size_type __new_size_00;
  long lVar11;
  vector<int,_std::allocator<int>_> *__range1;
  long local_c0;
  int local_b8;
  double local_68 [7];
  
  Imf_3_4::DeepScanLineInputPart::header();
  piVar5 = (int *)Imf_3_4::Header::dataWindow();
  iVar4 = *piVar5;
  iVar1 = piVar5[1];
  lVar10 = (long)((piVar5[2] - iVar4) + 1);
  __new_size_00 = ((piVar5[3] - iVar1) + 1) * lVar10;
  h = (Header *)Imf_3_4::DeepScanLineInputPart::header();
  iVar3 = channelCount(h);
  std::vector<int,_std::allocator<int>_>::resize(sampleCount,__new_size_00);
  lVar11 = iVar1 * lVar10 + (long)iVar4;
  __new_size = (size_type)iVar3;
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::resize(pixelPtrs,__new_size);
  local_c0 = 0;
  Imf_3_4::Slice::Slice
            ((Slice *)local_68,UINT,
             (char *)((sampleCount->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start + -lVar11),4,lVar10 * 4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)buf);
  Imf_3_4::Header::channels();
  p_Var6 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
  local_b8 = 0;
  while( true ) {
    Imf_3_4::Header::channels();
    p_Var7 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
    if (p_Var6 == p_Var7) break;
    std::vector<char_*,_std::allocator<char_*>_>::resize
              ((vector<char_*,_std::allocator<char_*>_> *)
               ((long)&(((pixelPtrs->
                         super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
                       super__Vector_impl_data + local_c0),__new_size_00);
    iVar4 = Imf_3_4::pixelTypeSize(p_Var6[9]._M_color);
    Imf_3_4::DeepSlice::DeepSlice
              ((DeepSlice *)local_68,p_Var6[9]._M_color,
               (char *)(*(long *)((long)&(((pixelPtrs->
                                           super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<char_*,_std::allocator<char_*>_>).
                                         _M_impl.super__Vector_impl_data + local_c0) + lVar11 * -8),
               8,lVar10 << 3,(long)iVar4,1,1,0.0,false,false);
    Imf_3_4::DeepFrameBuffer::insert((char *)buf,(DeepSlice *)(p_Var6 + 1));
    local_b8 = iVar4 + local_b8;
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    local_c0 = local_c0 + 0x18;
  }
  pvVar2 = inputSampleCount;
  if (inputSampleCount == (vector<int,_std::allocator<int>_> *)0x0) {
    Imf_3_4::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)in);
    lVar10 = std::chrono::_V2::steady_clock::now();
    Imf_3_4::DeepScanLineInputPart::readPixelSampleCounts((int)in,iVar1);
    lVar11 = std::chrono::_V2::steady_clock::now();
    local_68[0] = (double)(lVar11 - lVar10) / 1000000000.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(countPerf,local_68);
    pvVar2 = sampleCount;
  }
  lVar10 = 0;
  for (piVar5 = (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 != (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish; piVar5 = piVar5 + 1) {
    lVar10 = lVar10 + *piVar5;
  }
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::resize(sampleData,__new_size);
  Imf_3_4::DeepScanLineInputPart::header();
  Imf_3_4::Header::channels();
  p_Var6 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
  lVar11 = 0;
  while( true ) {
    Imf_3_4::DeepScanLineInputPart::header();
    Imf_3_4::Header::channels();
    p_Var7 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
    if (p_Var6 == p_Var7) break;
    iVar4 = Imf_3_4::pixelTypeSize(p_Var6[9]._M_color);
    std::vector<char,_std::allocator<char>_>::resize
              ((sampleData->
               super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + lVar11,iVar4 * lVar10);
    iVar3 = 0;
    for (lVar8 = 0; __new_size_00 - lVar8 != 0; lVar8 = lVar8 + 1) {
      *(long *)(*(long *)&(pixelPtrs->
                          super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[lVar11].
                          super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data + lVar8 * 8) =
           (long)(iVar3 * iVar4) +
           *(long *)&(sampleData->
                     super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar11].
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ;
      iVar3 = iVar3 + (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar8];
    }
    lVar11 = lVar11 + 1;
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  }
  if (inputSampleCount == (vector<int,_std::allocator<int>_> *)0x0) {
    lVar11 = std::chrono::_V2::steady_clock::now();
    Imf_3_4::DeepScanLineInputPart::readPixels((int)in,iVar1);
    lVar8 = std::chrono::_V2::steady_clock::now();
    local_68[0] = (double)(lVar8 - lVar11) / 1000000000.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(samplePerf,local_68);
  }
  partSizeData::partSizeData(__return_storage_ptr__);
  __return_storage_ptr__->pixelCount = __new_size_00;
  __return_storage_ptr__->rawSize = lVar10 * local_b8 + __new_size_00 * 4;
  __return_storage_ptr__->isDeep = true;
  Imf_3_4::DeepScanLineInputPart::header();
  Imf_3_4::Header::type_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->partType);
  Imf_3_4::DeepScanLineInputPart::header();
  pCVar9 = (Compression *)Imf_3_4::Header::compression();
  __return_storage_ptr__->compression = *pCVar9;
  __return_storage_ptr__->channelCount = __new_size;
  return __return_storage_ptr__;
}

Assistant:

partSizeData
initAndReadDeepScanLine (
    vector<int>&           sampleCount,
    vector<vector<char>>&  sampleData,
    vector<vector<char*>>& pixelPtrs,
    DeepFrameBuffer&       buf,
    DeepScanLineInputPart& in,
    const vector<int>*     inputSampleCount,
    const Header&          outHeader,
    vector<double>&        countPerf,
    vector<double>&        samplePerf)
{
    Box2i    dw        = in.header ().dataWindow ();
    uint64_t width     = dw.max.x + 1 - dw.min.x;
    uint64_t height    = dw.max.y + 1 - dw.min.y;
    uint64_t numPixels = width * height;
    int      numChans  = channelCount (in.header ());
    sampleCount.resize (numPixels);

    uint64_t offsetToOrigin = width * static_cast<uint64_t> (dw.min.y) +
                              static_cast<uint64_t> (dw.min.x);

    pixelPtrs.resize (numChans);

    buf.insertSampleCountSlice (Slice (
        UINT,
        (char*) (sampleCount.data () - offsetToOrigin),
        sizeof (int),
        sizeof (int) * width));
    int channelNumber  = 0;
    int bytesPerSample = 0;
    for (ChannelList::ConstIterator i = outHeader.channels ().begin ();
         i != outHeader.channels ().end ();
         ++i)
    {
        pixelPtrs[channelNumber].resize (numPixels);
        int samplesize = pixelTypeSize (i.channel ().type);
        buf.insert (
            i.name (),
            DeepSlice (
                i.channel ().type,
                (char*) (pixelPtrs[channelNumber].data () - offsetToOrigin),
                sizeof (char*),
                sizeof (char*) * width,
                samplesize));
        ++channelNumber;
        bytesPerSample += samplesize;
    }

    const vector<int>& samples = inputSampleCount ? *inputSampleCount
                                                  : sampleCount;
    if (!inputSampleCount)
    {
        in.setFrameBuffer (buf);

        steady_clock::time_point startCountRead = steady_clock::now ();
        in.readPixelSampleCounts (dw.min.y, dw.max.y);
        steady_clock::time_point endCountRead = steady_clock::now ();

        countPerf.push_back (timing (startCountRead, endCountRead));
    }

    size_t totalSamples = 0;

    for (int i: samples)
    {
        totalSamples += i;
    }

    sampleData.resize (numChans);
    channelNumber = 0;
    for (ChannelList::ConstIterator i = in.header ().channels ().begin ();
         i != in.header ().channels ().end ();
         ++i)
    {
        int samplesize = pixelTypeSize (i.channel ().type);
        sampleData[channelNumber].resize (samplesize * totalSamples);
        int offset = 0;
        for (uint64_t p = 0; p < numPixels; ++p)
        {
            pixelPtrs[channelNumber][p] =
                sampleData[channelNumber].data () + offset * samplesize;
            offset += samples[p];
        }

        ++channelNumber;
    }

    if (!inputSampleCount)
    {

        steady_clock::time_point startSampleRead = steady_clock::now ();
        in.readPixels (dw.min.y, dw.max.y);
        steady_clock::time_point endSampleRead = steady_clock::now ();
        samplePerf.push_back (timing (startSampleRead, endSampleRead));
    }

    partSizeData data;
    data.pixelCount = numPixels;

    //raw size includes the sample count table
    data.rawSize     = totalSamples * bytesPerSample + numPixels * sizeof (int);
    data.isDeep      = true;
    data.partType    = in.header ().type ();
    data.compression = in.header ().compression ();
    data.channelCount = numChans;

    return data;
}